

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

quint64 __thiscall QCss::Selector::pseudoClass(Selector *this,quint64 *negated)

{
  long lVar1;
  bool bVar2;
  BasicSelector *pBVar3;
  QList<QCss::Pseudo> *this_00;
  qsizetype qVar4;
  const_reference pPVar5;
  ulong *in_RSI;
  long in_FS_OFFSET;
  Pseudo *pseudo;
  int i;
  quint64 pc;
  BasicSelector *bs;
  QList<QCss::BasicSelector> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  uint local_4c;
  ulong local_48;
  quint64 local_28;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pBVar3 = QList<QCss::BasicSelector>::last(in_stack_ffffffffffffff88);
  bVar2 = QList<QCss::Pseudo>::isEmpty((QList<QCss::Pseudo> *)0xa37811);
  if (bVar2) {
    local_28 = 0x100;
  }
  else {
    local_48 = 0;
    pseudoElement((Selector *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    bVar2 = QString::isEmpty((QString *)0xa37847);
    local_4c = (uint)((bVar2 ^ 0xffU) & 1);
    QString::~QString((QString *)0xa3785c);
    while( true ) {
      this_00 = (QList<QCss::Pseudo> *)(long)(int)local_4c;
      qVar4 = QList<QCss::Pseudo>::size(&pBVar3->pseudos);
      if (qVar4 <= (long)this_00) break;
      pPVar5 = QList<QCss::Pseudo>::at(this_00,(qsizetype)in_stack_ffffffffffffff88);
      if (pPVar5->type == 0) {
        local_28 = 0;
        goto LAB_00a37922;
      }
      if ((pPVar5->negated & 1U) == 0) {
        local_48 = pPVar5->type | local_48;
      }
      else if (in_RSI != (ulong *)0x0) {
        *in_RSI = pPVar5->type | *in_RSI;
      }
      local_4c = local_4c + 1;
    }
    local_28 = local_48;
  }
LAB_00a37922:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_28;
}

Assistant:

quint64 Selector::pseudoClass(quint64 *negated) const
{
    const BasicSelector& bs = basicSelectors.last();
    if (bs.pseudos.isEmpty())
        return PseudoClass_Unspecified;
    quint64 pc = PseudoClass_Unknown;
    for (int i = !pseudoElement().isEmpty(); i < bs.pseudos.size(); i++) {
        const Pseudo &pseudo = bs.pseudos.at(i);
        if (pseudo.type == PseudoClass_Unknown)
            return PseudoClass_Unknown;
        if (!pseudo.negated)
            pc |= pseudo.type;
        else if (negated)
            *negated |= pseudo.type;
    }
    return pc;
}